

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O2

void __thiscall
chrono::ChArchiveIn::in<std::shared_ptr<chrono::ChBody>>
          (ChArchiveIn *this,
          ChNameValue<std::vector<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>_>
          *bVal)

{
  ulong uVar1;
  long lVar2;
  shared_ptr<chrono::ChBody> element;
  size_t arraysize;
  char idname [20];
  __shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2> local_78;
  size_type local_68;
  ChNameValue<std::shared_ptr<chrono::ChBody>_> local_60;
  char local_48 [24];
  
  std::vector<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>::
  clear(bVal->_value);
  (**(code **)(*(long *)this + 0x70))(this,bVal->_name,&local_68);
  std::vector<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>::
  resize(bVal->_value,local_68);
  lVar2 = 0;
  for (uVar1 = 0; uVar1 < local_68; uVar1 = uVar1 + 1) {
    sprintf(local_48,"%lu",uVar1);
    local_60._flags = '\0';
    local_78._M_ptr = (element_type *)0x0;
    local_78._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_60._name = local_48;
    local_60._value = (shared_ptr<chrono::ChBody> *)&local_78;
    in<chrono::ChBody>(this,&local_60);
    std::__shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2> *)
               ((long)&(((bVal->_value->
                         super__Vector_base<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>
                         )._M_impl.super__Vector_impl_data._M_start)->
                       super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr +
               lVar2),&local_78);
    (**(code **)(*(long *)this + 0x78))(this,bVal->_name);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78._M_refcount);
    lVar2 = lVar2 + 0x10;
  }
  (**(code **)(*(long *)this + 0x80))(this,bVal->_name);
  return;
}

Assistant:

void in     (ChNameValue< std::vector<T> > bVal) {
          bVal.value().clear();
          size_t arraysize;
          this->in_array_pre(bVal.name(), arraysize);
          bVal.value().resize(arraysize);
          for (size_t i = 0; i<arraysize; ++i)
          {
              char idname[20];
              sprintf(idname, "%lu", (unsigned long)i);
              T element;
              ChNameValue< T > array_val(idname, element);
              this->in (array_val);
              bVal.value()[i]=element;
              this->in_array_between(bVal.name());
          }
          this->in_array_end(bVal.name());
      }